

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hh
# Opt level: O1

Value __thiscall Typelib::FieldGetter::apply(FieldGetter *this,Value v,string *name)

{
  void *pvVar1;
  Type *pTVar2;
  FieldNotFound *this_00;
  Value VVar3;
  Value VVar4;
  
  VVar4.m_type.t_ = (Type *)v.m_data;
  std::__cxx11::string::_M_assign((string *)&this->m_name);
  pTVar2 = (Type *)Typelib::Registry::null();
  (this->m_field).m_data = (void *)0x0;
  (this->m_field).m_type.t_ = pTVar2;
  VVar4.m_data = this;
  Typelib::ValueVisitor::apply(VVar4);
  pvVar1 = (this->m_field).m_data;
  if (pvVar1 != (void *)0x0) {
    VVar3.m_type.t_ = (this->m_field).m_type.t_;
    VVar3.m_data = pvVar1;
    return VVar3;
  }
  this_00 = (FieldNotFound *)__cxa_allocate_exception(0x28);
  FieldNotFound::FieldNotFound(this_00,name);
  __cxa_throw(this_00,&FieldNotFound::typeinfo,FieldNotFound::~FieldNotFound);
}

Assistant:

Value apply(Value v, std::string const& name)
        {
            m_name = name;
            m_field = Value();
            ValueVisitor::apply(v);
            if (! m_field.getData())
                throw FieldNotFound(name);
            return m_field;
        }